

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

COVER_dictSelection_t *
COVER_selectDict(COVER_dictSelection_t *__return_storage_ptr__,BYTE *customDictContent,
                size_t dictBufferCapacity,size_t dictContentSize,BYTE *samplesBuffer,
                size_t *samplesSizes,uint nbFinalizeSamples,size_t nbCheckSamples,size_t nbSamples,
                ZDICT_cover_params_t params,size_t *offsets,size_t totalCompressedSize)

{
  BYTE *dict;
  BYTE *dict_00;
  size_t dictBufferCapacity_00;
  size_t sVar1;
  size_t dictBufferCapacity_01;
  size_t sVar2;
  ulong dictContentSize_00;
  undefined1 auVar3 [16];
  
  dict = (BYTE *)malloc(dictBufferCapacity);
  dict_00 = (BYTE *)malloc(dictBufferCapacity);
  if (dict == (BYTE *)0x0 || dict_00 == (BYTE *)0x0) {
    free(dict);
    sVar2 = dictContentSize;
  }
  else {
    memcpy(dict,customDictContent,dictContentSize);
    dictBufferCapacity_00 =
         ZDICT_finalizeDictionary
                   (dict,dictBufferCapacity,customDictContent,dictContentSize,samplesBuffer,
                    samplesSizes,nbFinalizeSamples,params.zParams);
    if (0xffffffffffffff88 < dictBufferCapacity_00) {
      free(dict);
      free(dict_00);
      __return_storage_ptr__->dictContent = (BYTE *)0x0;
      __return_storage_ptr__->dictSize = 0;
      __return_storage_ptr__->totalCompressedSize = dictBufferCapacity_00;
      return __return_storage_ptr__;
    }
    sVar1 = COVER_checkTotalCompressedSize
                      (params,samplesSizes,samplesBuffer,offsets,nbCheckSamples,nbSamples,dict,
                       dictBufferCapacity_00);
    if (sVar1 < 0xffffffffffffff89) {
      if (params.shrinkDict != 0) {
        if (0x100 < dictBufferCapacity_00) {
          dictContentSize_00 = 0x100;
          do {
            memcpy(dict_00,dict,dictBufferCapacity_00);
            dictBufferCapacity_01 =
                 ZDICT_finalizeDictionary
                           (dict_00,dictBufferCapacity,
                            customDictContent + (dictContentSize - dictContentSize_00),
                            dictContentSize_00,samplesBuffer,samplesSizes,nbFinalizeSamples,
                            params.zParams);
            if (0xffffffffffffff88 < dictBufferCapacity_01) {
              free(dict);
              free(dict_00);
              __return_storage_ptr__->dictContent = (BYTE *)0x0;
              __return_storage_ptr__->dictSize = 0;
              __return_storage_ptr__->totalCompressedSize = dictBufferCapacity_01;
              return __return_storage_ptr__;
            }
            sVar2 = COVER_checkTotalCompressedSize
                              (params,samplesSizes,samplesBuffer,offsets,nbCheckSamples,nbSamples,
                               dict_00,dictBufferCapacity_01);
            if (0xffffffffffffff88 < sVar2) {
              free(dict);
              free(dict_00);
              goto LAB_0019de1b;
            }
            auVar3._8_4_ = (int)(sVar2 >> 0x20);
            auVar3._0_8_ = sVar2;
            auVar3._12_4_ = 0x45300000;
            if (((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0) +
                (auVar3._8_8_ - 1.9342813113834067e+25) <=
                (((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0) +
                ((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25)) *
                ((double)params.shrinkDictMaxRegression / 100.0 + 1.0)) {
              free(dict);
              __return_storage_ptr__->dictContent = dict_00;
              __return_storage_ptr__->dictSize = dictBufferCapacity_01;
              sVar1 = sVar2;
              goto LAB_0019de20;
            }
            dictContentSize_00 = dictBufferCapacity_01 * 2;
          } while (dictContentSize_00 < dictBufferCapacity_00);
        }
        free(dict_00);
        __return_storage_ptr__->dictContent = dict;
        __return_storage_ptr__->dictSize = dictBufferCapacity_00;
        __return_storage_ptr__->totalCompressedSize = sVar1;
        return __return_storage_ptr__;
      }
      free(dict_00);
      __return_storage_ptr__->dictContent = dict;
      __return_storage_ptr__->dictSize = dictBufferCapacity_00;
      goto LAB_0019de20;
    }
    free(dict);
    sVar2 = sVar1;
  }
  free(dict_00);
LAB_0019de1b:
  __return_storage_ptr__->dictContent = (BYTE *)0x0;
  __return_storage_ptr__->dictSize = 0;
  sVar1 = sVar2;
LAB_0019de20:
  __return_storage_ptr__->totalCompressedSize = sVar1;
  return __return_storage_ptr__;
}

Assistant:

COVER_dictSelection_t COVER_selectDict(BYTE* customDictContent, size_t dictBufferCapacity,
        size_t dictContentSize, const BYTE* samplesBuffer, const size_t* samplesSizes, unsigned nbFinalizeSamples,
        size_t nbCheckSamples, size_t nbSamples, ZDICT_cover_params_t params, size_t* offsets, size_t totalCompressedSize) {

  size_t largestDict = 0;
  size_t largestCompressed = 0;
  BYTE* customDictContentEnd = customDictContent + dictContentSize;

  BYTE * largestDictbuffer = (BYTE *)malloc(dictBufferCapacity);
  BYTE * candidateDictBuffer = (BYTE *)malloc(dictBufferCapacity);
  double regressionTolerance = ((double)params.shrinkDictMaxRegression / 100.0) + 1.00;

  if (!largestDictbuffer || !candidateDictBuffer) {
    free(largestDictbuffer);
    free(candidateDictBuffer);
    return COVER_dictSelectionError(dictContentSize);
  }

  /* Initial dictionary size and compressed size */
  memcpy(largestDictbuffer, customDictContent, dictContentSize);
  dictContentSize = ZDICT_finalizeDictionary(
    largestDictbuffer, dictBufferCapacity, customDictContent, dictContentSize,
    samplesBuffer, samplesSizes, nbFinalizeSamples, params.zParams);

  if (ZDICT_isError(dictContentSize)) {
    free(largestDictbuffer);
    free(candidateDictBuffer);
    return COVER_dictSelectionError(dictContentSize);
  }

  totalCompressedSize = COVER_checkTotalCompressedSize(params, samplesSizes,
                                                       samplesBuffer, offsets,
                                                       nbCheckSamples, nbSamples,
                                                       largestDictbuffer, dictContentSize);

  if (ZSTD_isError(totalCompressedSize)) {
    free(largestDictbuffer);
    free(candidateDictBuffer);
    return COVER_dictSelectionError(totalCompressedSize);
  }

  if (params.shrinkDict == 0) {
    free(candidateDictBuffer);
    return setDictSelection(largestDictbuffer, dictContentSize, totalCompressedSize);
  }

  largestDict = dictContentSize;
  largestCompressed = totalCompressedSize;
  dictContentSize = ZDICT_DICTSIZE_MIN;

  /* Largest dict is initially at least ZDICT_DICTSIZE_MIN */
  while (dictContentSize < largestDict) {
    memcpy(candidateDictBuffer, largestDictbuffer, largestDict);
    dictContentSize = ZDICT_finalizeDictionary(
      candidateDictBuffer, dictBufferCapacity, customDictContentEnd - dictContentSize, dictContentSize,
      samplesBuffer, samplesSizes, nbFinalizeSamples, params.zParams);

    if (ZDICT_isError(dictContentSize)) {
      free(largestDictbuffer);
      free(candidateDictBuffer);
      return COVER_dictSelectionError(dictContentSize);

    }

    totalCompressedSize = COVER_checkTotalCompressedSize(params, samplesSizes,
                                                         samplesBuffer, offsets,
                                                         nbCheckSamples, nbSamples,
                                                         candidateDictBuffer, dictContentSize);

    if (ZSTD_isError(totalCompressedSize)) {
      free(largestDictbuffer);
      free(candidateDictBuffer);
      return COVER_dictSelectionError(totalCompressedSize);
    }

    if ((double)totalCompressedSize <= (double)largestCompressed * regressionTolerance) {
      free(largestDictbuffer);
      return setDictSelection( candidateDictBuffer, dictContentSize, totalCompressedSize );
    }
    dictContentSize *= 2;
  }
  dictContentSize = largestDict;
  totalCompressedSize = largestCompressed;
  free(candidateDictBuffer);
  return setDictSelection( largestDictbuffer, dictContentSize, totalCompressedSize );
}